

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O1

void google::protobuf::compiler::objectivec::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  pointer pcVar1;
  Type field_type;
  ObjectiveCType OVar2;
  LogMessage *other;
  mapped_type *pmVar3;
  char *pcVar4;
  string primitive_name;
  LogFinisher local_69;
  undefined1 local_68 [56];
  long *local_30 [2];
  long local_20 [2];
  
  field_type = FieldDescriptor::type(descriptor);
  OVar2 = GetObjectiveCType(field_type);
  if (OVar2 < (OBJECTIVECTYPE_MESSAGE|OBJECTIVECTYPE_UINT32)) {
    pcVar4 = *(char **)(&DAT_0042a2c0 + (ulong)OVar2 * 8);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_primitive_field.cc"
               ,0x52);
    other = internal::LogMessage::operator<<((LogMessage *)local_68,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    pcVar4 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)local_30,pcVar4,(allocator *)local_68);
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"type","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_68);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"storage_type","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_68);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           map<string, string>* variables) {
  std::string primitive_name = PrimitiveTypeName(descriptor);
  (*variables)["type"] = primitive_name;
  (*variables)["storage_type"] = primitive_name;
}